

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highs_c_api.cpp
# Opt level: O0

HighsInt Highs_setSolution(void *highs,double *col_value,double *row_value,double *col_dual,
                          double *row_dual)

{
  value_type vVar1;
  HighsInt HVar2;
  HighsStatus HVar3;
  reference pvVar4;
  long in_RCX;
  long in_RDX;
  long in_RSI;
  long in_R8;
  HighsInt i_3;
  HighsInt i_2;
  HighsInt num__row;
  HighsInt i_1;
  HighsInt i;
  HighsInt num__col;
  HighsSolution solution;
  undefined4 in_stack_ffffffffffffff10;
  undefined4 in_stack_ffffffffffffff14;
  undefined4 in_stack_ffffffffffffff28;
  undefined4 in_stack_ffffffffffffff2c;
  HighsInt HVar5;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffff30;
  int local_b8;
  int local_b4;
  int local_ac;
  int local_a8;
  vector<double,_std::allocator<double>_> local_88;
  vector<double,_std::allocator<double>_> local_70;
  vector<double,_std::allocator<double>_> local_58;
  vector<double,_std::allocator<double>_> local_40;
  long local_28;
  long local_20;
  long local_18;
  long local_10;
  
  local_28 = in_R8;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  HighsSolution::HighsSolution
            ((HighsSolution *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10));
  HVar2 = Highs_getNumCol((void *)0x439136);
  if (0 < HVar2) {
    if (local_10 != 0) {
      std::vector<double,_std::allocator<double>_>::resize
                (in_stack_ffffffffffffff30,
                 CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
      for (local_a8 = 0; local_a8 < HVar2; local_a8 = local_a8 + 1) {
        vVar1 = *(value_type *)(local_10 + (long)local_a8 * 8);
        pvVar4 = std::vector<double,_std::allocator<double>_>::operator[](&local_88,(long)local_a8);
        *pvVar4 = vVar1;
      }
    }
    if (local_20 != 0) {
      std::vector<double,_std::allocator<double>_>::resize
                (in_stack_ffffffffffffff30,
                 CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
      for (local_ac = 0; local_ac < HVar2; local_ac = local_ac + 1) {
        in_stack_ffffffffffffff30 =
             *(vector<double,_std::allocator<double>_> **)(local_20 + (long)local_ac * 8);
        pvVar4 = std::vector<double,_std::allocator<double>_>::operator[](&local_70,(long)local_ac);
        *pvVar4 = (value_type)in_stack_ffffffffffffff30;
      }
    }
  }
  HVar2 = Highs_getNumRow((void *)0x439266);
  if (0 < HVar2) {
    HVar5 = HVar2;
    if (local_18 != 0) {
      std::vector<double,_std::allocator<double>_>::resize
                (in_stack_ffffffffffffff30,CONCAT44(HVar2,in_stack_ffffffffffffff28));
      for (local_b4 = 0; local_b4 < HVar2; local_b4 = local_b4 + 1) {
        vVar1 = *(value_type *)(local_18 + (long)local_b4 * 8);
        pvVar4 = std::vector<double,_std::allocator<double>_>::operator[](&local_58,(long)local_b4);
        *pvVar4 = vVar1;
      }
    }
    if (local_28 != 0) {
      std::vector<double,_std::allocator<double>_>::resize
                (in_stack_ffffffffffffff30,CONCAT44(HVar5,in_stack_ffffffffffffff28));
      for (local_b8 = 0; local_b8 < HVar2; local_b8 = local_b8 + 1) {
        vVar1 = *(value_type *)(local_28 + (long)local_b8 * 8);
        pvVar4 = std::vector<double,_std::allocator<double>_>::operator[](&local_40,(long)local_b8);
        *pvVar4 = vVar1;
      }
    }
  }
  HVar3 = Highs::setSolution((Highs *)solution.row_value.
                                      super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                      super__Vector_impl_data._M_finish,
                             (HighsSolution *)
                             solution.row_value.super__Vector_base<double,_std::allocator<double>_>.
                             _M_impl.super__Vector_impl_data._M_start);
  HighsSolution::~HighsSolution((HighsSolution *)CONCAT44(HVar3,in_stack_ffffffffffffff10));
  return HVar3;
}

Assistant:

HighsInt Highs_setSolution(void* highs, const double* col_value,
                           const double* row_value, const double* col_dual,
                           const double* row_dual) {
  HighsSolution solution;
  const HighsInt num__col = Highs_getNumCol(highs);
  if (num__col > 0) {
    if (col_value) {
      solution.col_value.resize(num__col);
      for (HighsInt i = 0; i < num__col; i++)
        solution.col_value[i] = col_value[i];
    }
    if (col_dual) {
      solution.col_dual.resize(num__col);
      for (HighsInt i = 0; i < num__col; i++)
        solution.col_dual[i] = col_dual[i];
    }
  }
  const HighsInt num__row = Highs_getNumRow(highs);
  if (num__row > 0) {
    if (row_value) {
      solution.row_value.resize(num__row);
      for (HighsInt i = 0; i < num__row; i++)
        solution.row_value[i] = row_value[i];
    }
    if (row_dual) {
      solution.row_dual.resize(num__row);
      for (HighsInt i = 0; i < num__row; i++)
        solution.row_dual[i] = row_dual[i];
    }
  }

  return (HighsInt)((Highs*)highs)->setSolution(solution);
}